

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O2

void __thiscall chrono::ChTimestepperHHT::ArchiveIN(ChTimestepperHHT *this,ChArchiveIn *archive)

{
  HHT_Mode_mapper modemapper;
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> local_e0;
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> local_c0;
  ChNameValue<chrono::ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>_> local_a0;
  ChNameValue<bool> local_88;
  ChNameValue<double> local_70;
  ChNameValue<double> local_58;
  ChNameValue<double> local_40;
  
  ChArchiveIn::VersionRead<chrono::ChTimestepperHHT>(archive);
  ChTimestepper::ArchiveIN((ChTimestepper *)this,archive);
  ChImplicitIterativeTimestepper::ArchiveIN(&this->super_ChImplicitIterativeTimestepper,archive);
  local_40._value = &this->alpha;
  local_40._name = "alpha";
  local_40._flags = '\0';
  ChArchiveIn::operator>>(archive,&local_40);
  local_58._value = &this->beta;
  local_58._name = "beta";
  local_58._flags = '\0';
  ChArchiveIn::operator>>(archive,&local_58);
  local_70._value = &this->gamma;
  local_70._name = "gamma";
  local_70._flags = '\0';
  ChArchiveIn::operator>>(archive,&local_70);
  local_88._value = &this->scaling;
  local_88._name = "scaling";
  local_88._flags = '\0';
  ChArchiveIn::operator>>(archive,&local_88);
  my_enum_mappers::HHT_Mode_mapper::HHT_Mode_mapper((HHT_Mode_mapper *)&local_c0);
  my_enum_mappers::HHT_Mode_mapper::operator()(&local_e0,(HHT_Mode_mapper *)&local_c0,&this->mode);
  local_a0._name = "mode";
  local_a0._flags = '\0';
  local_a0._value = &local_e0;
  ChArchiveIn::operator>>(archive,&local_a0);
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>::~ChEnumMapper(&local_e0);
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>::~ChEnumMapper(&local_c0);
  return;
}

Assistant:

void ChTimestepperHHT::ArchiveIN(ChArchiveIn& archive) {
    // version number
    /*int version =*/ archive.VersionRead<ChTimestepperHHT>();
    // deserialize parent class:
    ChTimestepperIIorder::ArchiveIN(archive);
    ChImplicitIterativeTimestepper::ArchiveIN(archive);
    // stream in all member data:
    archive >> CHNVP(alpha);
    archive >> CHNVP(beta);
    archive >> CHNVP(gamma);
    archive >> CHNVP(scaling);
    my_enum_mappers::HHT_Mode_mapper modemapper;
    archive >> CHNVP(modemapper(mode), "mode");
}